

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O1

int * Gia_PermuteSpecialOrder(Gia_Man_t *p)

{
  Vec_Int_t *p_00;
  int *piVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  
  Gia_ManCreateRefs(p);
  iVar6 = p->vCis->nSize - p->nRegs;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar4 = iVar6;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar4;
  if (iVar4 == 0) {
    piVar1 = (int *)0x0;
  }
  else {
    piVar1 = (int *)malloc((long)iVar4 << 2);
  }
  p_00->pArray = piVar1;
  pVVar2 = p->vCis;
  uVar5 = (ulong)(uint)pVVar2->nSize;
  if (p->nRegs < pVVar2->nSize) {
    lVar7 = 0;
    do {
      if ((int)uVar5 <= lVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = pVVar2->pArray[lVar7];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Vec_IntPush(p_00,p->pRefs[iVar4]);
      lVar7 = lVar7 + 1;
      pVVar2 = p->vCis;
      uVar5 = (ulong)pVVar2->nSize;
    } while (lVar7 < (long)(uVar5 - (long)p->nRegs));
  }
  piVar1 = p_00->pArray;
  piVar3 = Abc_QuickSortCost(piVar1,p_00->nSize,1);
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  return piVar3;
}

Assistant:

int * Gia_PermuteSpecialOrder( Gia_Man_t * p )
{
    Vec_Int_t * vPerm;
    Gia_Obj_t * pObj;
    int i, * pOrder;
    Gia_ManCreateRefs( p );
    vPerm = Vec_IntAlloc( Gia_ManPiNum(p) );
    Gia_ManForEachPi( p, pObj, i )
        Vec_IntPush( vPerm, Gia_ObjRefNum(p, pObj) );
    pOrder = Abc_QuickSortCost( Vec_IntArray(vPerm), Vec_IntSize(vPerm), 1 );
    Vec_IntFree( vPerm );
    return pOrder;
}